

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GofAngle2.cpp
# Opt level: O3

void __thiscall
OpenMD::GofAngle2::collectHistogram(GofAngle2 *this,StuntDouble *sd1,StuntDouble *sd2)

{
  undefined4 *puVar1;
  int *piVar2;
  char cVar3;
  double dVar4;
  bool bVar5;
  uint i_5;
  double *pdVar6;
  undefined8 *puVar7;
  uint i;
  long lVar8;
  double *pdVar9;
  long lVar10;
  double (*padVar11) [3];
  undefined4 uVar12;
  double tmp;
  undefined4 uVar13;
  undefined4 uVar14;
  undefined4 uVar15;
  double tmp_4;
  double dVar16;
  double dVar17;
  Vector3d dipole2;
  Vector3d dipole1;
  Vector3d r12;
  Vector<double,_3U> result_4;
  MultipoleAdapter ma2;
  MultipoleAdapter ma1;
  Vector<double,_3U> result;
  Vector3d pos2;
  Vector3d pos1;
  undefined8 local_188;
  undefined8 uStack_180;
  undefined8 local_178;
  undefined8 local_168;
  undefined4 uStack_160;
  undefined4 uStack_15c;
  undefined8 local_158;
  Vector3d local_148;
  undefined8 local_128;
  undefined8 uStack_120;
  undefined8 local_118;
  MultipoleAdapter local_108;
  MultipoleAdapter local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  double local_e8 [8];
  double local_a8 [4];
  double local_88 [12];
  
  if (sd1 != sd2) {
    cVar3 = (((this->super_RadialDistrFunc).super_StaticAnalyser.info_)->simParams_->
            UsePeriodicBoundaryConditions).super_ParameterBase.field_0x2b;
    lVar8 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
    local_88[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)sd1->localIndex_ * 0x18);
    pdVar6 = (double *)(lVar8 + (long)sd1->localIndex_ * 0x18);
    local_88[0] = *pdVar6;
    local_88[1] = pdVar6[1];
    lVar8 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).position.
                             super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                             ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
    local_a8[2] = (double)*(undefined8 *)(lVar8 + 0x10 + (long)sd2->localIndex_ * 0x18);
    pdVar6 = (double *)(lVar8 + (long)sd2->localIndex_ * 0x18);
    local_a8[0] = *pdVar6;
    local_a8[1] = pdVar6[1];
    local_f8 = (double *)0x0;
    uStack_f0 = 0;
    local_e8[0] = 0.0;
    lVar8 = 0;
    do {
      (&local_f8)[lVar8] = local_88[lVar8] - local_a8[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    local_148.super_Vector<double,_3U>.data_[2] = local_e8[0];
    local_148.super_Vector<double,_3U>.data_[0]._0_4_ = (undefined4)local_f8;
    local_148.super_Vector<double,_3U>.data_[0]._4_4_ = local_f8._4_4_;
    local_148.super_Vector<double,_3U>.data_[1]._0_4_ = (undefined4)uStack_f0;
    local_148.super_Vector<double,_3U>.data_[1]._4_4_ = uStack_f0._4_4_;
    if (cVar3 != '\0') {
      Snapshot::wrapVector((this->super_RadialDistrFunc).currentSnapshot_,&local_148);
    }
    local_100.at_ = (AtomType *)sd1[1]._vptr_StuntDouble;
    local_108.at_ = (AtomType *)sd2[1]._vptr_StuntDouble;
    if (1 < sd1->objType_ - otDAtom) {
      (*sd1->_vptr_StuntDouble[7])(&local_f8,sd1);
      snprintf(painCave.errMsg,2000,"GofAngle2: attempted to use a non-directional object: %s\n");
      if (local_f8 != local_e8) {
        operator_delete(local_f8,(long)local_e8[0] + 1);
      }
      painCave.isFatal = 1;
      simError();
    }
    if (1 < sd2->objType_ - otDAtom) {
      (*sd2->_vptr_StuntDouble[7])(&local_f8,sd2);
      snprintf(painCave.errMsg,2000,"GofAngle2: attempted to use a non-directional object: %s\n");
      if (local_f8 != local_e8) {
        operator_delete(local_f8,(long)local_e8[0] + 1);
      }
      painCave.isFatal = 1;
      simError();
    }
    bVar5 = MultipoleAdapter::isDipole(&local_100);
    if (bVar5) {
      lVar8 = *(long *)((long)&(sd1->snapshotMan_->currentSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd1->storage_);
      local_158 = *(undefined8 *)(lVar8 + 0x10 + (long)sd1->localIndex_ * 0x18);
      puVar1 = (undefined4 *)(lVar8 + (long)sd1->localIndex_ * 0x18);
      local_168._0_4_ = *puVar1;
      local_168._4_4_ = puVar1[1];
      uStack_160 = puVar1[2];
      uStack_15c = puVar1[3];
    }
    else {
      padVar11 = (double (*) [3])(local_88 + 3);
      StuntDouble::getA((RotMat3x3d *)padVar11,sd1);
      pdVar6 = (double *)&local_f8;
      local_e8[4] = 0.0;
      local_e8[5] = 0.0;
      local_e8[2] = 0.0;
      local_e8[3] = 0.0;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_f8 = (double *)0x0;
      uStack_f0 = 0;
      local_e8[6] = 0.0;
      lVar8 = 0;
      do {
        lVar10 = 0;
        pdVar9 = pdVar6;
        do {
          *pdVar9 = (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar10];
          lVar10 = lVar10 + 1;
          pdVar9 = pdVar9 + 3;
        } while (lVar10 != 3);
        lVar8 = lVar8 + 1;
        pdVar6 = pdVar6 + 1;
        padVar11 = padVar11 + 1;
      } while (lVar8 != 3);
      local_188 = 0;
      uStack_180 = 0;
      local_178 = 0;
      puVar7 = &local_f8;
      lVar8 = 0;
      do {
        dVar4 = (double)(&local_188)[lVar8];
        lVar10 = 0;
        do {
          dVar4 = dVar4 + *(double *)((long)puVar7 + lVar10) *
                          *(double *)((long)&OpenMD::V3Z + lVar10);
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x18);
        (&local_188)[lVar8] = dVar4;
        lVar8 = lVar8 + 1;
        puVar7 = puVar7 + 3;
      } while (lVar8 != 3);
      local_158 = local_178;
      local_168._0_4_ = (undefined4)local_188;
      local_168._4_4_ = local_188._4_4_;
      uStack_160 = (undefined4)uStack_180;
      uStack_15c = uStack_180._4_4_;
    }
    bVar5 = MultipoleAdapter::isDipole(&local_108);
    if (bVar5) {
      lVar8 = *(long *)((long)&(sd2->snapshotMan_->currentSnapshot_->atomData).dipole.
                               super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + sd2->storage_);
      local_178 = *(undefined8 *)(lVar8 + 0x10 + (long)sd2->localIndex_ * 0x18);
      puVar1 = (undefined4 *)(lVar8 + (long)sd2->localIndex_ * 0x18);
      uVar12 = *puVar1;
      uVar13 = puVar1[1];
      uVar14 = puVar1[2];
      uVar15 = puVar1[3];
    }
    else {
      padVar11 = (double (*) [3])(local_88 + 3);
      StuntDouble::getA((RotMat3x3d *)padVar11,sd2);
      pdVar6 = (double *)&local_f8;
      local_e8[4] = 0.0;
      local_e8[5] = 0.0;
      local_e8[2] = 0.0;
      local_e8[3] = 0.0;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_f8 = (double *)0x0;
      uStack_f0 = 0;
      local_e8[6] = 0.0;
      lVar8 = 0;
      do {
        lVar10 = 0;
        pdVar9 = pdVar6;
        do {
          *pdVar9 = (((SquareMatrix<double,_3> *)*padVar11)->super_RectMatrix<double,_3U,_3U>).data_
                    [0][lVar10];
          lVar10 = lVar10 + 1;
          pdVar9 = pdVar9 + 3;
        } while (lVar10 != 3);
        lVar8 = lVar8 + 1;
        pdVar6 = pdVar6 + 1;
        padVar11 = padVar11 + 1;
      } while (lVar8 != 3);
      local_128 = 0;
      uStack_120 = 0;
      local_118 = 0;
      puVar7 = &local_f8;
      lVar8 = 0;
      do {
        dVar4 = (double)(&local_128)[lVar8];
        lVar10 = 0;
        do {
          dVar4 = dVar4 + *(double *)((long)puVar7 + lVar10) *
                          *(double *)((long)&OpenMD::V3Z + lVar10);
          lVar10 = lVar10 + 8;
        } while (lVar10 != 0x18);
        (&local_128)[lVar8] = dVar4;
        lVar8 = lVar8 + 1;
        puVar7 = puVar7 + 3;
      } while (lVar8 != 3);
      local_178 = local_118;
      uVar12 = (undefined4)local_128;
      uVar13 = local_128._4_4_;
      uVar14 = (undefined4)uStack_120;
      uVar15 = uStack_120._4_4_;
    }
    local_188 = CONCAT44(uVar13,uVar12);
    uStack_180 = CONCAT44(uVar15,uVar14);
    dVar4 = 0.0;
    lVar8 = 0;
    do {
      dVar16 = local_148.super_Vector<double,_3U>.data_[lVar8];
      dVar4 = dVar4 + dVar16 * dVar16;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    lVar8 = 0;
    do {
      local_148.super_Vector<double,_3U>.data_[lVar8] =
           local_148.super_Vector<double,_3U>.data_[lVar8] / dVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    dVar4 = 0.0;
    lVar8 = 0;
    do {
      dVar4 = dVar4 + (double)(&local_168)[lVar8] * (double)(&local_168)[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    lVar8 = 0;
    do {
      (&local_168)[lVar8] = (double)(&local_168)[lVar8] / dVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    dVar4 = 0.0;
    lVar8 = 0;
    do {
      dVar4 = dVar4 + (double)(&local_188)[lVar8] * (double)(&local_188)[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    if (dVar4 < 0.0) {
      dVar4 = sqrt(dVar4);
    }
    else {
      dVar4 = SQRT(dVar4);
    }
    lVar8 = 0;
    do {
      (&local_188)[lVar8] = (double)(&local_188)[lVar8] / dVar4;
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    dVar4 = 0.0;
    lVar8 = 0;
    do {
      dVar4 = dVar4 + local_148.super_Vector<double,_3U>.data_[lVar8] * (double)(&local_168)[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    dVar16 = 0.0;
    lVar8 = 0;
    do {
      dVar16 = dVar16 + (double)(&local_168)[lVar8] * (double)(&local_188)[lVar8];
      lVar8 = lVar8 + 1;
    } while (lVar8 != 3);
    dVar17 = (double)((this->super_RadialDistrFunc).super_StaticAnalyser.nBins_ - 1) * 0.5;
    piVar2 = (int *)(*(long *)&(this->histogram_).
                               super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start
                               [(int)((dVar4 + 1.0) * dVar17)].
                               super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data + (long)(int)((dVar16 + 1.0) * dVar17) * 4);
    *piVar2 = *piVar2 + 1;
    this->npairs_ = this->npairs_ + 1;
  }
  return;
}

Assistant:

void GofAngle2::collectHistogram(StuntDouble* sd1, StuntDouble* sd2) {
    bool usePeriodicBoundaryConditions_ =
        info_->getSimParams()->getUsePeriodicBoundaryConditions();

    if (sd1 == sd2) { return; }

    Vector3d pos1 = sd1->getPos();
    Vector3d pos2 = sd2->getPos();
    Vector3d r12  = pos1 - pos2;
    if (usePeriodicBoundaryConditions_) currentSnapshot_->wrapVector(r12);

    AtomType* atype1     = static_cast<Atom*>(sd1)->getAtomType();
    AtomType* atype2     = static_cast<Atom*>(sd2)->getAtomType();
    MultipoleAdapter ma1 = MultipoleAdapter(atype1);
    MultipoleAdapter ma2 = MultipoleAdapter(atype2);

    if (!sd1->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofAngle2: attempted to use a non-directional object: %s\n",
               sd1->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    if (!sd2->isDirectional()) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "GofAngle2: attempted to use a non-directional object: %s\n",
               sd2->getType().c_str());
      painCave.isFatal = 1;
      simError();
    }

    Vector3d dipole1, dipole2;
    if (ma1.isDipole())
      dipole1 = sd1->getDipole();
    else
      dipole1 = sd1->getA().transpose() * V3Z;

    if (ma2.isDipole())
      dipole2 = sd2->getDipole();
    else
      dipole2 = sd2->getA().transpose() * V3Z;

    r12.normalize();
    dipole1.normalize();
    dipole2.normalize();

    RealType cosAngle1 = dot(r12, dipole1);
    RealType cosAngle2 = dot(dipole1, dipole2);

    RealType halfBin = (nBins_ - 1) * 0.5;
    int angleBin1    = int(halfBin * (cosAngle1 + 1.0));
    int angleBin2    = int(halfBin * (cosAngle2 + 1.0));

    ++histogram_[angleBin1][angleBin2];
    ++npairs_;
  }